

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader-test.cc
# Opt level: O0

void __thiscall
NLStringRefTest_ConstructFromStdString_Test::TestBody
          (NLStringRefTest_ConstructFromStdString_Test *this)

{
  undefined1 uVar1;
  bool bVar2;
  undefined1 uVar3;
  char *pcVar4;
  unsigned_long *expected;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  NLStringRef s;
  string str;
  string *in_stack_fffffffffffffed8;
  undefined7 in_stack_fffffffffffffee0;
  undefined1 in_stack_fffffffffffffee7;
  char **in_stack_fffffffffffffee8;
  char *in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef8;
  int in_stack_fffffffffffffefc;
  int line;
  char *in_stack_ffffffffffffff00;
  undefined8 in_stack_ffffffffffffff08;
  Type type;
  undefined7 in_stack_ffffffffffffff10;
  undefined1 in_stack_ffffffffffffff17;
  char *in_stack_ffffffffffffff18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  AssertionResult local_b8;
  Message *in_stack_ffffffffffffff58;
  AssertHelper *in_stack_ffffffffffffff60;
  AssertionResult local_88 [2];
  undefined4 local_64;
  AssertionResult local_60;
  NLStringRef local_50 [2];
  undefined1 local_29 [41];
  
  type = (Type)((ulong)in_stack_ffffffffffffff08 >> 0x20);
  this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_29;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this_00,in_stack_ffffffffffffff18,
             (allocator<char> *)CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10));
  std::allocator<char>::~allocator((allocator<char> *)local_29);
  mp::NLStringRef::NLStringRef
            ((NLStringRef *)CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0),
             in_stack_fffffffffffffed8);
  local_64 = 0;
  mp::NLStringRef::c_str(local_50);
  std::__cxx11::string::size();
  testing::internal::EqHelper<true>::Compare<int,char>
            ((char *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
             in_stack_fffffffffffffef0,(int *)in_stack_fffffffffffffee8,
             (char *)CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0),
             in_stack_fffffffffffffed8);
  uVar1 = testing::AssertionResult::operator_cast_to_bool(&local_60);
  if (!(bool)uVar1) {
    testing::Message::Message((Message *)CONCAT17(uVar1,in_stack_ffffffffffffff10));
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x13ade4);
    type = (Type)((ulong)pcVar4 >> 0x20);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(uVar1,in_stack_ffffffffffffff10),type,
               in_stack_ffffffffffffff00,in_stack_fffffffffffffefc,in_stack_fffffffffffffef0);
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0));
    testing::Message::~Message((Message *)0x13ae41);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x13ae99);
  std::__cxx11::string::c_str();
  pcVar4 = mp::NLStringRef::c_str(local_50);
  testing::internal::EqHelper<false>::Compare<char_const*,char_const*>
            ((char *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
             in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
             (char **)CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0));
  bVar2 = testing::AssertionResult::operator_cast_to_bool(local_88);
  line = CONCAT13(bVar2,(int3)in_stack_fffffffffffffefc);
  if (!bVar2) {
    testing::Message::Message((Message *)CONCAT17(uVar1,in_stack_ffffffffffffff10));
    in_stack_fffffffffffffef0 =
         testing::AssertionResult::failure_message((AssertionResult *)0x13af65);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(uVar1,in_stack_ffffffffffffff10),type,pcVar4,line,
               in_stack_fffffffffffffef0);
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0));
    testing::Message::~Message((Message *)0x13afc2);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x13b01a);
  std::__cxx11::string::size();
  expected = (unsigned_long *)mp::NLStringRef::size(local_50);
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((char *)CONCAT44(line,in_stack_fffffffffffffef8),in_stack_fffffffffffffef0,expected,
             (unsigned_long *)CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0));
  uVar3 = testing::AssertionResult::operator_cast_to_bool(&local_b8);
  if (!(bool)uVar3) {
    testing::Message::Message((Message *)CONCAT17(uVar1,in_stack_ffffffffffffff10));
    testing::AssertionResult::failure_message((AssertionResult *)0x13b0ce);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(uVar1,in_stack_ffffffffffffff10),type,pcVar4,line,
               in_stack_fffffffffffffef0);
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(uVar3,in_stack_fffffffffffffee0));
    testing::Message::~Message((Message *)0x13b11a);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x13b166);
  std::__cxx11::string::~string((string *)(local_29 + 1));
  return;
}

Assistant:

TEST(NLStringRefTest, ConstructFromStdString) {
  std::string str = "foo";
  const mp::NLStringRef s(str);
  EXPECT_EQ(0, s.c_str()[str.size()]);
  EXPECT_EQ(str.c_str(), s.c_str());
  EXPECT_EQ(str.size(), s.size());
}